

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int asciiToAscii(uchar *out,int *poutlen,uchar *in,int *pinlen,void *vctxt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  
  if (in == (uchar *)0x0) {
    *pinlen = 0;
    *poutlen = 0;
    return 0;
  }
  iVar1 = *pinlen;
  iVar2 = *poutlen;
  iVar3 = iVar2;
  if (iVar1 <= iVar2) {
    iVar3 = iVar1;
  }
  iVar5 = -3;
  if (iVar1 <= iVar2) {
    iVar5 = iVar1;
  }
  *poutlen = iVar3;
  *pinlen = iVar3;
  if (0 < iVar3) {
    lVar6 = 0;
    do {
      if ((char)in[lVar6] < '\0') {
        *poutlen = (int)lVar6;
        *pinlen = (int)lVar6;
        return -2;
      }
      out[lVar6] = in[lVar6];
      lVar4 = lVar6 + 1;
      lVar6 = lVar6 + 1;
    } while (in + lVar4 < in + iVar3);
  }
  return iVar5;
}

Assistant:

static int
asciiToAscii(unsigned char* out, int *poutlen,
             const unsigned char* in, int *pinlen,
             void *vctxt ATTRIBUTE_UNUSED) {
    const unsigned char *inend;
    const unsigned char *instart = in;
    int inlen, outlen, ret;

    if (in == NULL) {
        *pinlen = 0;
        *poutlen = 0;
        return(XML_ENC_ERR_SUCCESS);
    }

    inlen = *pinlen;
    outlen = *poutlen;

    if (outlen < inlen) {
        inlen = outlen;
        ret = XML_ENC_ERR_SPACE;
    } else {
        ret = inlen;
    }

    inend = in + inlen;
    *poutlen = inlen;
    *pinlen = inlen;

    while (in < inend) {
	unsigned c = *in;

        if (c >= 0x80) {
	    *poutlen = in - instart;
	    *pinlen = in - instart;
	    return(XML_ENC_ERR_INPUT);
	}

        in++;
	*out++ = c;
    }

    return(ret);
}